

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O1

BigInteger * __thiscall rapidjson::internal::BigInteger::operator*=(BigInteger *this,uint64_t u)

{
  ulong uVar1;
  Type digit;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  if (u != 1) {
    if (u == 0) {
      this->digits_[0] = 0;
    }
    else {
      if ((this->count_ != 1) || (this->digits_[0] != 1)) {
        if (this->count_ == 0) {
          digit = 0;
        }
        else {
          uVar2 = 0;
          digit = 0;
          do {
            uVar1 = this->digits_[uVar2] & 0xffffffff;
            uVar3 = this->digits_[uVar2] >> 0x20;
            uVar5 = uVar1 * (u & 0xffffffff);
            uVar7 = uVar3 * (u & 0xffffffff);
            lVar4 = uVar3 * (u >> 0x20);
            uVar1 = uVar1 * (u >> 0x20) + uVar7 + (uVar5 >> 0x20);
            lVar6 = lVar4 + 0x100000000;
            if (uVar7 <= uVar1) {
              lVar6 = lVar4;
            }
            uVar3 = (uVar5 & 0xffffffff) + digit + (uVar1 << 0x20);
            digit = (uVar1 >> 0x20) + lVar6 + (ulong)(uVar3 < digit);
            this->digits_[uVar2] = uVar3;
            uVar2 = uVar2 + 1;
          } while (uVar2 < this->count_);
        }
        if (digit == 0) {
          return this;
        }
        PushBack(this,digit);
        return this;
      }
      this->digits_[0] = u;
    }
    this->count_ = 1;
  }
  return this;
}

Assistant:

BigInteger& operator*=(uint64_t u) {
        if (u == 0) return *this = 0;
        if (u == 1) return *this;
        if (*this == 1) return *this = u;

        uint64_t k = 0;
        for (size_t i = 0; i < count_; i++) {
            uint64_t hi;
            digits_[i] = MulAdd64(digits_[i], u, k, &hi);
            k = hi;
        }
        
        if (k > 0)
            PushBack(k);

        return *this;
    }